

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O1

int CountNest(char *s)

{
  int iVar1;
  uint uVar2;
  char *__s1;
  
  iVar1 = strcmp(s,"ENDC");
  uVar2 = 0xffffffff;
  if (iVar1 != 0) {
    iVar1 = strcmp(s,"ENDIF");
    if (((iVar1 != 0) && (uVar2 = 0, *s == 'I')) && (s[1] == 'F')) {
      __s1 = s + 2;
      iVar1 = strcmp(__s1,"EQ");
      uVar2 = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"NE");
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"GT");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"GE");
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1,"LT");
              if (iVar1 != 0) {
                iVar1 = strcmp(__s1,"LE");
                if (iVar1 != 0) {
                  iVar1 = strcmp(__s1,"C");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(__s1,"NC");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(__s1,"D");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(__s1,"ND");
                        uVar2 = (uint)(iVar1 == 0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int CountNest(s)
	register char *s;
/* Returns 1 if "s" contains any IF statement (i.e. IFEQ, etc.).
 Returns -1 if "s" contains "ENDC" or "ENDIF".
 Returns 0 in all other cases.              */
{
	if (strcmp(s, "ENDC") == 0)
		return (-1);
	else if (strcmp(s, "ENDIF") == 0)
		return (-1);
	else if (*s++ != 'I')
		return (0);
	else if (*s++ != 'F')
		return (0);
	else if (strcmp(s, "EQ") == 0)
		return (1);
	else if (strcmp(s, "NE") == 0)
		return (1);
	else if (strcmp(s, "GT") == 0)
		return (1);
	else if (strcmp(s, "GE") == 0)
		return (1);
	else if (strcmp(s, "LT") == 0)
		return (1);
	else if (strcmp(s, "LE") == 0)
		return (1);
	else if (strcmp(s, "C") == 0)
		return (1);
	else if (strcmp(s, "NC") == 0)
		return (1);
	else if (strcmp(s, "D") == 0)
		return (1);
	else if (strcmp(s, "ND") == 0)
		return (1);
	else
		return (0);
}